

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

clause * solver2_propagate(sat_solver2 *s)

{
  cla h;
  cla *pcVar1;
  lit *v;
  int iVar2;
  int iVar3;
  uint uVar4;
  lit l;
  int iVar5;
  clause cVar6;
  int *piVar7;
  veci *v_00;
  clause *pcVar8;
  clause *pcVar9;
  cla *pcVar10;
  bool bVar11;
  int fLitIsFalse;
  int Var;
  int Cid;
  int proof_id;
  int x;
  int k_1;
  int Lit;
  cla *j;
  cla *i;
  cla *end;
  cla *begin;
  lit *k;
  lit *stop;
  lit p;
  lit false_lit;
  lit *lits;
  veci *ws;
  clause *confl;
  clause *c;
  sat_solver2 *s_local;
  
  ws = (veci *)0x0;
  c = (clause *)s;
  do {
    bVar11 = false;
    if (ws == (veci *)0x0) {
      bVar11 = 0 < (int)c[3] - (int)c[2];
    }
    if (!bVar11) {
      return (clause *)ws;
    }
    cVar6 = c[2];
    c[2] = (clause)((int)cVar6 + 1);
    stop._0_4_ = *(lit *)(*(long *)(c + 0x40) + (long)(int)cVar6 * 4);
    lits = &solver2_wlist((sat_solver2 *)c,(lit)stop)->cap;
    piVar7 = veci_begin((veci *)lits);
    end = piVar7;
    iVar2 = veci_size((veci *)lits);
    i = piVar7 + iVar2;
    *(long *)(c + 0x88) = *(long *)(c + 0x88) + 1;
    _k_1 = end;
    for (j = end; pcVar10 = _k_1, j < i; j = j + 1) {
      confl = clause2_read((sat_solver2 *)c,*j);
      _p = confl + 1;
      stop._4_4_ = (clause)lit_neg((lit)stop);
      pcVar8 = c;
      if (*_p == stop._4_4_) {
        *_p = _p[1];
        _p[1] = stop._4_4_;
      }
      if (_p[1] != stop._4_4_) {
        __assert_fail("lits[1] == false_lit",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0x3a2,"clause *solver2_propagate(sat_solver2 *)");
      }
      iVar2 = lit_var((lit)*_p);
      iVar2 = var_value((sat_solver2 *)pcVar8,iVar2);
      iVar3 = lit_sign((lit)*_p);
      if (iVar2 == iVar3) {
        *_k_1 = *j;
        _k_1 = _k_1 + 1;
      }
      else {
        k = (lit *)(_p + (int)((uint)*confl >> 0xb));
        for (begin = (cla *)(_p + 2); pcVar8 = c, begin < k; begin = begin + 1) {
          iVar2 = lit_var(*begin);
          uVar4 = var_value((sat_solver2 *)pcVar8,iVar2);
          iVar2 = lit_sign(*begin);
          pcVar8 = c;
          if (uVar4 != ((iVar2 != 0 ^ 0xffU) & 1)) {
            _p[1] = (clause)*begin;
            *begin = (cla)stop._4_4_;
            l = lit_neg((lit)_p[1]);
            v_00 = solver2_wlist((sat_solver2 *)pcVar8,l);
            veci_push(v_00,*j);
            goto LAB_0066253c;
          }
        }
        x = *(int *)_p;
        if ((c[0x1b] != (clause)0x0) && (iVar2 = solver2_dlevel((sat_solver2 *)c), iVar2 == 0)) {
          iVar2 = lit_var(x);
          uVar4 = var_value((sat_solver2 *)c,iVar2);
          iVar3 = lit_sign(x);
          proof_chain_start((sat_solver2 *)c,confl);
          proof_id = 1;
          while( true ) {
            bVar11 = false;
            if (proof_id < (int)((uint)*confl >> 0xb)) {
              Cid = lit_var((lit)confl[(long)proof_id + 1]);
              bVar11 = Cid != 0;
            }
            if (!bVar11) break;
            iVar5 = var_level((sat_solver2 *)c,Cid);
            if (iVar5 != 0) {
              __assert_fail("var_level(s, x) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                            ,0x3bb,"clause *solver2_propagate(sat_solver2 *)");
            }
            proof_chain_resolve((sat_solver2 *)c,(clause *)0x0,Cid);
            proof_id = proof_id + 1;
          }
          iVar5 = proof_chain_stop((sat_solver2 *)c);
          iVar5 = clause2_create_new((sat_solver2 *)c,&x,&k_1,1,iVar5);
          pcVar8 = var_unit_clause((sat_solver2 *)c,iVar2);
          if ((pcVar8 == (clause *)0x0) == (uVar4 == ((iVar3 != 0 ^ 0xffU) & 1))) {
            __assert_fail("(var_unit_clause(s, Var) == NULL) != fLitIsFalse",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x3c1,"clause *solver2_propagate(sat_solver2 *)");
          }
          pcVar9 = var_unit_clause((sat_solver2 *)c,iVar2);
          pcVar8 = c;
          if (pcVar9 == (clause *)0x0) {
            var_set_unit_clause((sat_solver2 *)c,iVar2,iVar5);
          }
          else {
            pcVar9 = clause2_read((sat_solver2 *)c,iVar5);
            proof_chain_start((sat_solver2 *)pcVar8,pcVar9);
            proof_chain_resolve((sat_solver2 *)c,(clause *)0x0,iVar2);
            cVar6 = (clause)proof_chain_stop((sat_solver2 *)c);
            c[0x79] = cVar6;
          }
        }
        pcVar10 = _k_1 + 1;
        *_k_1 = *j;
        _k_1 = pcVar10;
        if (((uint)*confl & 1) != 0) {
          uVar4 = sat_clause_compute_lbd((sat_solver2 *)c,confl);
          *confl = (clause)((uint)*confl & 0xfffff807 | (uVar4 & 0xff) << 3);
        }
        iVar2 = solver2_enqueue((sat_solver2 *)c,x,*j);
        if (iVar2 == 0) {
          h = *j;
          j = j + 1;
          ws = (veci *)clause2_read((sat_solver2 *)c,h);
          while (j < i) {
            *_k_1 = *j;
            _k_1 = _k_1 + 1;
            j = j + 1;
          }
        }
      }
LAB_0066253c:
    }
    piVar7 = veci_begin((veci *)lits);
    v = lits;
    pcVar1 = _k_1;
    *(long *)(c + 0x8a) = ((long)pcVar10 - (long)piVar7 >> 2) + *(long *)(c + 0x8a);
    piVar7 = veci_begin((veci *)lits);
    veci_resize((veci *)v,(int)((long)pcVar1 - (long)piVar7 >> 2));
  } while( true );
}

Assistant:

clause* solver2_propagate(sat_solver2* s)
{
    clause* c, * confl  = NULL;
    veci* ws;
    lit* lits, false_lit, p, * stop, * k;
    cla* begin,* end, *i, *j;
    int Lit;

    while (confl == 0 && s->qtail - s->qhead > 0){

        p  = s->trail[s->qhead++];
        ws = solver2_wlist(s,p);
        begin = (cla*)veci_begin(ws);
        end   = begin + veci_size(ws);

        s->stats.propagations++;
        for (i = j = begin; i < end; ){
            c = clause2_read(s,*i);
            lits = c->lits;

            // Make sure the false literal is data[1]:
            false_lit = lit_neg(p);
            if (lits[0] == false_lit){
                lits[0] = lits[1];
                lits[1] = false_lit;
            }
            assert(lits[1] == false_lit);

            // If 0th watch is true, then clause is already satisfied.
            if (var_value(s, lit_var(lits[0])) == lit_sign(lits[0]))
                *j++ = *i;
            else{
                // Look for new watch:
                stop = lits + c->size;
                for (k = lits + 2; k < stop; k++){
                    if (var_value(s, lit_var(*k)) != !lit_sign(*k)){
                        lits[1] = *k;
                        *k = false_lit;
                        veci_push(solver2_wlist(s,lit_neg(lits[1])),*i);
                        goto WatchFound; }
                }

                // Did not find watch -- clause is unit under assignment:
                Lit = lits[0];
                if ( s->fProofLogging && solver2_dlevel(s) == 0 )
                {
                    int k, x, proof_id, Cid, Var = lit_var(Lit);
                    int fLitIsFalse = (var_value(s, Var) == !lit_sign(Lit));
                    // Log production of top-level unit clause:
                    proof_chain_start( s, c );
                    clause_foreach_var( c, x, k, 1 ){
                        assert( var_level(s, x) == 0 );
                        proof_chain_resolve( s, NULL, x );
                    }
                    proof_id = proof_chain_stop( s );
                    // get a new clause
                    Cid = clause2_create_new( s, &Lit, &Lit + 1, 1, proof_id );
                    assert( (var_unit_clause(s, Var) == NULL) != fLitIsFalse );
                    // if variable already has unit clause, it must be with the other polarity 
                    // in this case, we should derive the empty clause here
                    if ( var_unit_clause(s, Var) == NULL )
                        var_set_unit_clause(s, Var, Cid);
                    else{
                        // Empty clause derived:
                        proof_chain_start( s, clause2_read(s,Cid) );
                        proof_chain_resolve( s, NULL, Var );
                        proof_id = proof_chain_stop( s );
                        s->hProofLast = proof_id;
//                        clause2_create_new( s, &Lit, &Lit, 1, proof_id );
                    }
                }

                *j++ = *i;
                // Clause is unit under assignment:
                if ( c->lrn )
                    c->lbd = sat_clause_compute_lbd(s, c);
                if (!solver2_enqueue(s,Lit, *i)){
                    confl = clause2_read(s,*i++);
                    // Copy the remaining watches:
                    while (i < end)
                        *j++ = *i++;
                }
            }
WatchFound: i++;
        }
        s->stats.inspects += j - (int*)veci_begin(ws);
        veci_resize(ws,j - (int*)veci_begin(ws));
    }

    return confl;
}